

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O0

BaseRefVectorOf<char16_t> *
xercesc_4_0::XMLString::tokenizeString(XMLCh *tokenizeSrc,MemoryManager *manager)

{
  XMLSize_t startIndex;
  MemoryManager *src;
  bool bVar1;
  int iVar2;
  BaseRefVectorOf<char16_t> *this;
  XMLCh *srcStrLength;
  undefined4 extraout_var;
  XMLCh *token;
  XMLSize_t index;
  XMLSize_t skip;
  XMLSize_t len;
  RefArrayVectorOf<char16_t> *tokenStack;
  XMLCh *tokenizeStr;
  ArrayJanitor<char16_t> janText;
  XMLCh *orgText;
  MemoryManager *manager_local;
  XMLCh *tokenizeSrc_local;
  
  janText.fMemoryManager = (MemoryManager *)replicate(tokenizeSrc,manager);
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)&tokenizeStr,(char16_t *)janText.fMemoryManager,manager);
  src = janText.fMemoryManager;
  this = (BaseRefVectorOf<char16_t> *)XMemory::operator_new(0x30,manager);
  RefArrayVectorOf<char16_t>::RefArrayVectorOf((RefArrayVectorOf<char16_t> *)this,0x10,true,manager)
  ;
  srcStrLength = (XMLCh *)stringLen((XMLCh *)src);
  token = (XMLCh *)0x0;
  while (token != srcStrLength) {
    index = (XMLSize_t)token;
    while ((startIndex = index, index < srcStrLength &&
           (bVar1 = XMLChar1_0::isWhitespace
                              (*(XMLCh *)((long)&src->_vptr_MemoryManager + index * 2)), bVar1))) {
      index = index + 1;
    }
    while ((index < srcStrLength &&
           (bVar1 = XMLChar1_0::isWhitespace
                              (*(XMLCh *)((long)&src->_vptr_MemoryManager + index * 2)), !bVar1))) {
      index = index + 1;
    }
    if (index == startIndex) break;
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,(index - startIndex) * 2 + 2);
    subString((XMLCh *)CONCAT44(extraout_var,iVar2),(XMLCh *)src,startIndex,index,
              (XMLSize_t)srcStrLength,manager);
    BaseRefVectorOf<char16_t>::addElement(this,(XMLCh *)CONCAT44(extraout_var,iVar2));
    token = (XMLCh *)index;
  }
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&tokenizeStr);
  return this;
}

Assistant:

BaseRefVectorOf<XMLCh>* XMLString::tokenizeString(const XMLCh*      const   tokenizeSrc
                                               ,  MemoryManager*    const   manager)
{
    XMLCh* orgText = replicate(tokenizeSrc, manager);
    ArrayJanitor<XMLCh> janText(orgText, manager);
    XMLCh* tokenizeStr = orgText;

    RefArrayVectorOf<XMLCh>* tokenStack = new (manager) RefArrayVectorOf<XMLCh>(16, true, manager);

    XMLSize_t len = stringLen(tokenizeStr);
    XMLSize_t skip;
    XMLSize_t index = 0;

    while (index != len) {
        // find the first non-space character
        for (skip = index; skip < len; skip++)
        {
            if (!XMLChar1_0::isWhitespace(tokenizeStr[skip]))
                break;
        }
        index = skip;

        // find the delimiter (space character)
        for (; skip < len; skip++)
        {
            if (XMLChar1_0::isWhitespace(tokenizeStr[skip]))
                break;
        }

        // we reached the end of the string
        if (skip == index)
            break;

        // these tokens are adopted in the RefVector and will be deleted
        // when the vector is deleted by the caller
        XMLCh* token = (XMLCh*) manager->allocate
        (
            (skip+1-index) * sizeof(XMLCh)
        );//new XMLCh[skip+1-index];

        XMLString::subString(token, tokenizeStr, index, skip, len, manager);
        tokenStack->addElement(token);
        index = skip;
    }
    return tokenStack;
}